

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_read_scatter_single_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  kvtree *pkVar4;
  uint uVar5;
  char *pcVar6;
  char *__format;
  uint uVar7;
  int rank;
  kvtree *kvtree;
  int local_2068;
  int argc_local;
  kvtree *tree;
  char *local_2058;
  char *tmp_str;
  char **argv_local;
  int ranks;
  char prefix [4096];
  char tmp [4096];
  
  tmp_str = (char *)0x0;
  kvtree = (kvtree *)0x0;
  argc_local = argc;
  argv_local = argv;
  if (argc != 2) {
    puts("USAGE:");
    putchar(10);
    printf("    %s TEMP_DIRECTORY\n",*argv);
    putchar(10);
    puts("TEMP_DIRECTORY: A temporary directory to store test files in.");
    exit(1);
  }
  local_2058 = argv[1];
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,&ranks);
  pkVar4 = (kvtree *)kvtree_new();
  local_2068 = ranks;
  uVar7 = 0;
  if (0 < ranks) {
    uVar7 = ranks;
  }
  tree = pkVar4;
  for (uVar5 = 0; pcVar1 = local_2058, uVar7 != uVar5; uVar5 = uVar5 + 1) {
    sprintf(prefix,"%d",(ulong)uVar5);
    kvtree_util_set_str(pkVar4,prefix,"test data");
  }
  snprintf(tmp,0x1000,"%s/PREFIX",local_2058);
  iVar3 = local_2068;
  tmp[0xfff] = '\0';
  iVar2 = kvtree_write_to_gather(tmp,pkVar4,local_2068);
  if (iVar2 != 0) {
    kvtree_delete(&tree);
LAB_001013e0:
    puts("Error creating files");
    return 1;
  }
  iVar2 = 0;
  snprintf(tmp,0x1000,"%s/PREFIX.0",pcVar1);
  tmp[0xfff] = '\0';
  iVar3 = kvtree_write_to_gather(tmp,tree,iVar3);
  kvtree_delete(&tree);
  if (iVar3 != 0) goto LAB_001013e0;
  MPI_Barrier(&ompi_mpi_comm_world);
  if (rank != 0) goto LAB_001014a9;
  snprintf(prefix,0x1000,"%s/PREFIX",pcVar1);
  prefix[0xfff] = '\0';
  kvtree = (kvtree *)kvtree_new();
  iVar3 = kvtree_read_scatter_single(prefix,kvtree);
  if (iVar3 == 0) {
    kvtree_util_get_str(kvtree,"0",&tmp_str);
    pcVar6 = tmp_str;
    iVar3 = strcmp(tmp_str,"test data");
    if (iVar3 != 0) {
      __format = "Got back wrong data (got %s, expected \"test data\")\n";
      goto LAB_0010149f;
    }
    kvtree_print(kvtree,4);
    kvtree_delete(&kvtree);
    iVar2 = 0;
    snprintf(tmp,0x1000,"%s/PREFIX.0.0",pcVar1);
    unlink(tmp);
    kvtree = (kvtree *)kvtree_new();
    iVar3 = kvtree_read_scatter_single(prefix,kvtree);
    if (iVar3 != 0) goto LAB_001014a9;
    puts("kvtree_read_scatter_single() with missing file incorrectly succeeded");
  }
  else {
    __format = "test_kvtree_read_scatter_single failed for %s\n";
    pcVar6 = prefix;
LAB_0010149f:
    printf(__format,pcVar6);
  }
  iVar2 = 1;
LAB_001014a9:
  kvtree_delete(&kvtree);
  if (rank == 0) {
    snprintf(tmp,0x1000,"rm -f %s/PREFIX*",pcVar1);
    system(tmp);
  }
  MPI_Finalize();
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
  int rc;
  char tmp[PATH_MAX];
  char* prefix_dir;
  char* tmp_str = NULL;
  char prefix[PATH_MAX];
  int rank, ranks;
  kvtree* kvtree = NULL;

  if (argc != 2) {
    printf("USAGE:\n");
    printf("\n");
    printf("    %s TEMP_DIRECTORY\n", argv[0]);
    printf("\n");
    printf("TEMP_DIRECTORY: A temporary directory to store test files in.\n");
    exit(1);
  }

  prefix_dir = argv[1];

  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);

  /* Create our prefix files */
  rc = create_files(prefix_dir, ranks);
  if (rc != 0) {
    printf("Error creating files\n");
    return 1;
  }

  MPI_Barrier(MPI_COMM_WORLD);

  /* Only read back the file with rank 0 */
  if (rank != 0) {
    rc = 0;
    goto end;
  }

  /* Construct path to our main PREFIX file */
  snprintf(prefix, sizeof(prefix), "%s/PREFIX", prefix_dir);
  prefix[sizeof(prefix) - 1] = '\0';

  /* Read our PREFIX files */
  kvtree = kvtree_new();
  rc = kvtree_read_scatter_single(prefix, kvtree);
  if (rc != KVTREE_SUCCESS) {
    printf("test_kvtree_read_scatter_single failed for %s\n", prefix);
    rc = 1;
    goto end;
  }

  /* Sanity test a value */
  kvtree_util_get_str(kvtree, "0", &tmp_str);
  if (strcmp(tmp_str, "test data") != 0) {
    printf("Got back wrong data (got %s, expected \"test data\")\n", tmp_str);
    rc = 1;
    goto end;
  }
  kvtree_print(kvtree, 4);
  kvtree_delete(&kvtree);

  /*
   * Remove PREFIX.0.0 to induce a failure.
   */
  snprintf(tmp, sizeof(tmp), "%s/PREFIX.0.0", prefix_dir);
  unlink(tmp);

  /* Attempt to call kvtree_read_scatter_single() - it should fail. */
  kvtree = kvtree_new();
  rc = kvtree_read_scatter_single(prefix, kvtree);
  if (rc == KVTREE_SUCCESS) {
    printf("kvtree_read_scatter_single() with missing file incorrectly succeeded\n");
    rc = 1;
  } else {
    /* success */
    rc = 0;
  }

end:
  kvtree_delete(&kvtree);

  if (rank == 0) {
    /* Remove our test files */
    snprintf(tmp, sizeof(tmp), "rm -f %s/PREFIX*", prefix_dir);
    system(tmp);
  }
  MPI_Finalize();

  return rc;
}